

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.c
# Opt level: O1

uLong cm_zlib_adler32_z(uLong adler,Bytef *buf,z_size_t len)

{
  undefined1 auVar1 [16];
  z_size_t zVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uLong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  
  uVar17 = adler & 0xffff;
  uVar5 = adler >> 0x10 & 0xffff;
  if (len == 1) {
    uVar4 = uVar17 + *buf;
    uVar17 = (uVar17 - 0xfff1) + (ulong)*buf;
    if (uVar4 < 0xfff1) {
      uVar17 = uVar4;
    }
    uVar7 = (uVar5 + uVar17) * 0x10000;
    uVar4 = uVar7 - 0xfff10000;
    if (uVar5 + uVar17 < 0xfff1) {
      uVar4 = uVar7;
    }
    uVar16 = uVar4 | uVar17;
  }
  else if (buf == (Bytef *)0x0) {
    uVar16 = 1;
  }
  else if (len < 0x10) {
    if (len != 0) {
      zVar2 = 0;
      do {
        uVar17 = uVar17 + buf[zVar2];
        uVar5 = uVar5 + uVar17;
        zVar2 = zVar2 + 1;
      } while (len != zVar2);
    }
    uVar4 = uVar17 - 0xfff1;
    if (uVar17 < 0xfff1) {
      uVar4 = uVar17;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5;
    iVar6 = SUB164(auVar1 * ZEXT816(0xf00e10d2fc5cd),8);
    uVar16 = ((int)uVar5 + (((uint)((int)uVar5 - iVar6) >> 1) + iVar6 >> 0xf) * -0xfff1) * 0x10000 |
             uVar4;
  }
  else {
    if (0x15af < len) {
      do {
        len = len - 0x15b0;
        lVar3 = 0;
        do {
          lVar8 = buf[lVar3] + uVar17;
          lVar18 = (ulong)buf[lVar3 + 1] + lVar8;
          lVar9 = (ulong)buf[lVar3 + 2] + lVar18;
          lVar19 = (ulong)buf[lVar3 + 3] + lVar9;
          lVar10 = (ulong)buf[lVar3 + 4] + lVar19;
          lVar20 = (ulong)buf[lVar3 + 5] + lVar10;
          lVar11 = (ulong)buf[lVar3 + 6] + lVar20;
          lVar21 = (ulong)buf[lVar3 + 7] + lVar11;
          lVar12 = (ulong)buf[lVar3 + 8] + lVar21;
          lVar22 = (ulong)buf[lVar3 + 9] + lVar12;
          lVar13 = (ulong)buf[lVar3 + 10] + lVar22;
          lVar23 = (ulong)buf[lVar3 + 0xb] + lVar13;
          lVar14 = (ulong)buf[lVar3 + 0xc] + lVar23;
          lVar24 = (ulong)buf[lVar3 + 0xd] + lVar14;
          lVar15 = (ulong)buf[lVar3 + 0xe] + lVar24;
          uVar17 = (ulong)buf[lVar3 + 0xf] + lVar15;
          uVar5 = uVar5 + lVar8 + lVar18 + lVar9 + lVar19 + lVar10 + lVar20 + lVar11 + lVar21 +
                  lVar12 + lVar22 + lVar13 + lVar23 + lVar14 + lVar24 + lVar15 + uVar17;
          lVar3 = lVar3 + 0x10;
        } while ((int)lVar3 != 0x15b0);
        buf = buf + 0x15b0;
        uVar17 = uVar17 % 0xfff1;
        uVar5 = uVar5 % 0xfff1;
      } while (0x15af < len);
    }
    if (len != 0) {
      for (; 0xf < len; len = len - 0x10) {
        lVar3 = *buf + uVar17;
        lVar15 = (ulong)buf[1] + lVar3;
        lVar8 = (ulong)buf[2] + lVar15;
        lVar18 = (ulong)buf[3] + lVar8;
        lVar9 = (ulong)buf[4] + lVar18;
        lVar19 = (ulong)buf[5] + lVar9;
        lVar10 = (ulong)buf[6] + lVar19;
        lVar20 = (ulong)buf[7] + lVar10;
        lVar11 = (ulong)buf[8] + lVar20;
        lVar21 = (ulong)buf[9] + lVar11;
        lVar12 = (ulong)buf[10] + lVar21;
        lVar22 = (ulong)buf[0xb] + lVar12;
        lVar13 = (ulong)buf[0xc] + lVar22;
        lVar23 = (ulong)buf[0xd] + lVar13;
        lVar14 = (ulong)buf[0xe] + lVar23;
        uVar17 = (ulong)buf[0xf] + lVar14;
        uVar5 = uVar5 + lVar3 + lVar15 + lVar8 + lVar18 + lVar9 + lVar19 + lVar10 + lVar20 + lVar11
                + lVar21 + lVar12 + lVar22 + lVar13 + lVar23 + lVar14 + uVar17;
        buf = buf + 0x10;
      }
      if (len != 0) {
        uVar4 = 0;
        do {
          uVar17 = uVar17 + buf[uVar4];
          uVar5 = uVar5 + uVar17;
          uVar4 = uVar4 + 1;
        } while (len != uVar4);
      }
      uVar17 = uVar17 % 0xfff1;
      uVar5 = uVar5 % 0xfff1;
    }
    uVar16 = uVar5 << 0x10 | uVar17;
  }
  return uVar16;
}

Assistant:

uLong ZEXPORT adler32_z(uLong adler, const Bytef *buf, z_size_t len) {
    unsigned long sum2;
    unsigned n;

    /* split Adler-32 into component sums */
    sum2 = (adler >> 16) & 0xffff;
    adler &= 0xffff;

    /* in case user likes doing a byte at a time, keep it fast */
    if (len == 1) {
        adler += buf[0];
        if (adler >= BASE)
            adler -= BASE;
        sum2 += adler;
        if (sum2 >= BASE)
            sum2 -= BASE;
        return adler | (sum2 << 16);
    }

    /* initial Adler-32 value (deferred check for len == 1 speed) */
    if (buf == Z_NULL)
        return 1L;

    /* in case short lengths are provided, keep it somewhat fast */
    if (len < 16) {
        while (len--) {
            adler += *buf++;
            sum2 += adler;
        }
        if (adler >= BASE)
            adler -= BASE;
        MOD28(sum2);            /* only added so many BASE's */
        return adler | (sum2 << 16);
    }

    /* do length NMAX blocks -- requires just one modulo operation */
    while (len >= NMAX) {
        len -= NMAX;
        n = NMAX / 16;          /* NMAX is divisible by 16 */
        do {
            DO16(buf);          /* 16 sums unrolled */
            buf += 16;
        } while (--n);
        MOD(adler);
        MOD(sum2);
    }

    /* do remaining bytes (less than NMAX, still just one modulo) */
    if (len) {                  /* avoid modulos if none remaining */
        while (len >= 16) {
            len -= 16;
            DO16(buf);
            buf += 16;
        }
        while (len--) {
            adler += *buf++;
            sum2 += adler;
        }
        MOD(adler);
        MOD(sum2);
    }

    /* return recombined sums */
    return adler | (sum2 << 16);
}